

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.hpp
# Opt level: O0

void __thiscall
crsGA::
GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
::mutation(GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
           *this)

{
  bool bVar1;
  result_type_conflict rVar2;
  reference this_00;
  GenesArray *this_01;
  reference pGVar3;
  element_type *peVar4;
  result_type_conflict1 rVar5;
  Gen *gen;
  iterator __end0_1;
  iterator __begin0_1;
  GenesArray *__range3;
  Chromosome<Gen,_ComputeFitness> *c;
  iterator __end0;
  iterator __begin0;
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  *__range2;
  uniform_real_distribution<float> uni;
  undefined1 local_2720 [8];
  mt19937 rng;
  random_device rd;
  GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
  *this_local;
  
  std::random_device::random_device((random_device *)&rng._M_p);
  rVar2 = std::random_device::operator()((random_device *)&rng._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2720,(ulong)rVar2);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)((long)&__range2 + 4),0.0,1.0);
  __end0 = std::
           vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ::begin(&this->_fittestChromosomes);
  c = (Chromosome<Gen,_ComputeFitness> *)
      std::
      vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
      ::end(&this->_fittestChromosomes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
                                *)&c);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
              ::operator*(&__end0);
    this_01 = Chromosome<Gen,_ComputeFitness>::getGenes(this_00);
    __end0_1 = std::vector<Gen,_std::allocator<Gen>_>::begin(this_01);
    gen = (Gen *)std::vector<Gen,_std::allocator<Gen>_>::end(this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end0_1,
                         (__normal_iterator<Gen_*,_std::vector<Gen,_std::allocator<Gen>_>_> *)&gen);
      if (!bVar1) break;
      pGVar3 = __gnu_cxx::__normal_iterator<Gen_*,_std::vector<Gen,_std::allocator<Gen>_>_>::
               operator*(&__end0_1);
      rVar5 = std::uniform_real_distribution<float>::operator()
                        ((uniform_real_distribution<float> *)((long)&__range2 + 4),
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_2720);
      if (this->_mutationFactor <= rVar5 && rVar5 != this->_mutationFactor) {
        peVar4 = std::__shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(this->_data).
                             super___shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>);
        (*(pGVar3->super_IGen)._vptr_IGen[2])(pGVar3,peVar4);
      }
      __gnu_cxx::__normal_iterator<Gen_*,_std::vector<Gen,_std::allocator<Gen>_>_>::operator++
                (&__end0_1);
    }
    __gnu_cxx::
    __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
    ::operator++(&__end0);
  }
  std::random_device::~random_device((random_device *)&rng._M_p);
  return;
}

Assistant:

void mutation()
    {
        //Select a random crossover point
        std::random_device rd;                             // used once to initialise (seed) engine
        std::mt19937 rng(rd());                            // random-number engine used (Mersenne-Twister in this case)
        std::uniform_real_distribution<float> uni(0, 1.0); // guaranteed unbiased

        for (auto &c : _fittestChromosomes)
        {
            //Select if mutate this chromosome
            for (auto &gen : c.getGenes())
            {
                if (uni(rng) > _mutationFactor) // random mutation
                {
                    gen.mutate(_data.get());
                }
            }
        }

        //_population.mutate(_mutationFactor, _data.get());
    }